

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O2

void Minisat::selectionSort<Minisat::Option*,Minisat::Option::OptionLt>(long array,uint size)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  OptionLt local_41;
  ulong local_40;
  ulong local_38;
  
  uVar3 = 1;
  if (1 < (int)size) {
    uVar3 = size;
  }
  local_40 = (ulong)(uVar3 - 1);
  uVar6 = 1;
  for (uVar5 = 0; uVar5 != local_40; uVar5 = uVar5 + 1) {
    uVar7 = uVar5 & 0xffffffff;
    local_38 = uVar6;
    while( true ) {
      lVar4 = (long)(int)(uint)uVar7;
      if (size == uVar6) break;
      bVar2 = Option::OptionLt::operator()
                        (&local_41,*(Option **)(array + uVar6 * 8),*(Option **)(array + lVar4 * 8));
      uVar3 = (uint)uVar6;
      if (!bVar2) {
        uVar3 = (uint)uVar7;
      }
      uVar6 = uVar6 + 1;
      uVar7 = (ulong)uVar3;
    }
    uVar1 = *(undefined8 *)(array + uVar5 * 8);
    *(undefined8 *)(array + uVar5 * 8) = *(undefined8 *)(array + lVar4 * 8);
    *(undefined8 *)(array + lVar4 * 8) = uVar1;
    uVar6 = local_38 + 1;
  }
  return;
}

Assistant:

void selectionSort(T* array, int size, LessThan lt)
{
    int     i, j, best_i;
    T       tmp;

    for (i = 0; i < size-1; i++){
        best_i = i;
        for (j = i+1; j < size; j++){
            if (lt(array[j], array[best_i]))
                best_i = j;
        }
        tmp = array[i]; array[i] = array[best_i]; array[best_i] = tmp;
    }
}